

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O2

void slang::ast::NetSymbol::fromSyntax
               (Scope *scope,NetDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::NetSymbol_*> *results)

{
  undefined1 *puVar1;
  TokenKind TVar2;
  Compilation *this;
  size_t sVar3;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  NetType *args_2;
  DeclaratorSyntax *decl;
  NetSymbol *this_00;
  ExpansionHint EVar4;
  NetSymbol *net;
  char *local_70;
  const_iterator __begin2;
  SourceLocation local_38;
  
  this = scope->compilation;
  args_2 = Compilation::getNetType(this,(syntax->netType).kind);
  TVar2 = (syntax->expansionHint).kind;
  EVar4 = Vectored;
  if (TVar2 != VectoredKeyword) {
    EVar4 = (uint)(TVar2 == ScalaredKeyword) * 2;
  }
  __begin2.index = 0;
  sVar3 = (syntax->declarators).elements._M_extent._M_extent_value;
  __begin2.list = &syntax->declarators;
  for (; (__begin2.list != &syntax->declarators || (__begin2.index != sVar3 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
           iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&__begin2);
    _net = parsing::Token::valueText(&decl->name);
    local_38 = parsing::Token::location(&decl->name);
    this_00 = BumpAllocator::
              emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                        (&this->super_BumpAllocator,
                         (basic_string_view<char,_std::char_traits<char>_> *)&net,&local_38,args_2);
    net = this_00;
    this_00->expansionHint = EVar4;
    (this_00->super_ValueSymbol).declaredType.typeOrLink =
         (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
    puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
    *puVar1 = *puVar1 & 0x7f;
    ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes((Symbol *)net,scope,syntax_00);
    SmallVectorBase<slang::ast::NetSymbol_const*>::emplace_back<slang::ast::NetSymbol_const*const&>
              ((SmallVectorBase<slang::ast::NetSymbol_const*> *)results,&net);
  }
  return;
}

Assistant:

void NetSymbol::fromSyntax(const Scope& scope, const NetDeclarationSyntax& syntax,
                           SmallVectorBase<const NetSymbol*>& results) {
    auto& comp = scope.getCompilation();
    const NetType& netType = comp.getNetType(syntax.netType.kind);

    ExpansionHint expansionHint = ExpansionHint::None;
    switch (syntax.expansionHint.kind) {
        case TokenKind::VectoredKeyword:
            expansionHint = ExpansionHint::Vectored;
            break;
        case TokenKind::ScalaredKeyword:
            expansionHint = ExpansionHint::Scalared;
            break;
        default:
            break;
    }

    for (auto declarator : syntax.declarators) {
        auto net = comp.emplace<NetSymbol>(declarator->name.valueText(),
                                           declarator->name.location(), netType);
        net->expansionHint = expansionHint;
        net->setDeclaredType(*syntax.type);
        net->setFromDeclarator(*declarator);
        net->setAttributes(scope, syntax.attributes);
        results.push_back(net);
    }
}